

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::FunctionExpression::Deserialize(FunctionExpression *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var1;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var3;
  FunctionExpression *this_00;
  pointer pFVar4;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_28;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> local_20;
  
  this_00 = (FunctionExpression *)operator_new(0xd8);
  FunctionExpression(this_00);
  local_28._M_head_impl = this_00;
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"function_name",&pFVar4->function_name);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"schema",&pFVar4->schema);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,0xca,"children",&pFVar4->children);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xcb,"filter",&pFVar4->filter);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
            ((Deserializer *)&stack0xffffffffffffffe0,(field_id_t)deserializer,(char *)0xcc);
  _Var3._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (OrderModifier *)0x0;
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  _Var1._M_head_impl =
       (pFVar4->order_bys).
       super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
       super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl;
  (pFVar4->order_bys).
  super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
  super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
  super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (OrderModifier *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ResultModifier + 8))();
  }
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xcd,"distinct",&pFVar4->distinct);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xce,"is_operator",&pFVar4->is_operator);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xcf,"export_state",&pFVar4->export_state);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_28);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xd0,"catalog",&pFVar4->catalog);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (FunctionExpression *)0x0;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)_Var2._M_head_impl;
  if (local_20._M_head_impl != (OrderModifier *)0x0) {
    (**(code **)(*(_func_int **)local_20._M_head_impl + 8))();
    if (local_28._M_head_impl != (FunctionExpression *)0x0) {
      (*((local_28._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> FunctionExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<FunctionExpression>(new FunctionExpression());
	deserializer.ReadPropertyWithDefault<string>(200, "function_name", result->function_name);
	deserializer.ReadPropertyWithDefault<string>(201, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(202, "children", result->children);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(203, "filter", result->filter);
	auto order_bys = deserializer.ReadPropertyWithDefault<unique_ptr<ResultModifier>>(204, "order_bys");
	result->order_bys = unique_ptr_cast<ResultModifier, OrderModifier>(std::move(order_bys));
	deserializer.ReadPropertyWithDefault<bool>(205, "distinct", result->distinct);
	deserializer.ReadPropertyWithDefault<bool>(206, "is_operator", result->is_operator);
	deserializer.ReadPropertyWithDefault<bool>(207, "export_state", result->export_state);
	deserializer.ReadPropertyWithDefault<string>(208, "catalog", result->catalog);
	return std::move(result);
}